

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O3

void lj_snap_replay(jit_State *J,GCtrace *T)

{
  SnapShot *pSVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  undefined4 uVar5;
  IRIns *pIVar6;
  bool bVar7;
  bool bVar8;
  ushort uVar9;
  ushort uVar10;
  IRRef1 IVar11;
  TRef TVar12;
  uint uVar13;
  TRef TVar14;
  ulong uVar15;
  ulong uVar16;
  IRIns *pIVar17;
  IRIns *pIVar18;
  uint uVar19;
  IRIns *pIVar20;
  IRIns *pIVar21;
  ulong uVar22;
  uint uVar23;
  BloomFilter seen;
  ulong uVar24;
  IRIns *pIVar25;
  SnapEntry *map;
  IRRef allocref;
  
  pSVar1 = T->snap + J->exitno;
  map = T->snapmap + pSVar1->mapofs;
  bVar2 = pSVar1->nent;
  uVar15 = (ulong)bVar2;
  J->framedepth = 0;
  bVar7 = true;
  if (bVar2 != 0) {
    uVar24 = 0;
    seen = 0;
    bVar7 = false;
    do {
      uVar13 = map[uVar24];
      uVar23 = uVar13 >> 0x18;
      uVar19 = uVar13 & 0xffff;
      pIVar21 = (IRIns *)((ulong)(uVar19 * 8) + (long)T->ir);
      uVar22 = 1L << ((byte)uVar13 & 0x3f);
      if ((uVar24 != 0) && ((uVar22 & seen) != 0)) {
        uVar16 = 0;
        do {
          if ((map[uVar16] & 0xffff) == uVar19) {
            TVar12 = J->slot[map[uVar16] >> 0x18] & 0xfffcffff;
            if (TVar12 != 0) goto LAB_00145e51;
            break;
          }
          uVar16 = uVar16 + 1;
        } while (uVar24 != uVar16);
      }
      seen = seen | uVar22;
      if (uVar19 < 0x8000) {
        TVar12 = snap_replay_const(J,pIVar21);
      }
      else if (((pIVar21->field_0).prev & 0xff80) == 0x80) {
        bVar7 = true;
        TVar12 = uVar23;
      }
      else {
        uVar9 = 0x21;
        if ((pIVar21->field_1).o == 'F') {
          uVar9 = (pIVar21->field_0).op2 & 0x10 | 0x21;
        }
        (J->fold).ins.field_0.ot = (pIVar21->field_1).t.irt & 0x1f | 0x4600;
        *(ushort *)&(J->fold).ins = (ushort)(byte)(uVar13 >> 0x18);
        (J->fold).ins.field_0.op2 = uVar9;
        TVar12 = lj_ir_emit(J);
      }
LAB_00145e51:
      J->slot[uVar23] = TVar12 | uVar13 & 0x30000;
      J->framedepth = J->framedepth + (uint)(0xffffff < uVar13 && (uVar13 & 0x30000) != 0);
      if ((uVar13 >> 0x10 & 1) != 0) {
        J->baseslot = uVar23 + 1;
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != uVar15);
    if ((bVar7) && (uVar15 != 0)) {
      pIVar21 = T->ir + pSVar1->ref;
      uVar24 = 0;
      bVar8 = false;
      do {
        uVar13 = map[uVar24];
        pIVar20 = T->ir;
        pIVar25 = pIVar20 + (uVar13 & 0xffff);
        uVar19 = (uint)bVar2;
        if ((pIVar25->field_1).r == 0xfd) {
          if (J->slot[uVar13 >> 0x18] == uVar13 >> 0x18) {
            bVar3 = lj_ir_mode[(pIVar25->field_1).o];
            if ((bVar3 & 3) == 0) {
              snap_pref(J,(GCtrace *)&pIVar20->field_0,map,uVar19,seen,(uint)(pIVar25->field_0).op1)
              ;
            }
            if ((bVar3 & 0xc) == 0) {
              snap_pref(J,(GCtrace *)&T->ir->field_0,map,uVar19,seen,(uint)(pIVar25->field_0).op2);
            }
            bVar8 = true;
            pIVar20 = pIVar25;
            if ((pIVar25->field_1).o != 'R') {
LAB_00145f80:
              pIVar18 = pIVar20;
              pIVar20 = pIVar18 + 1;
              if (pIVar20 < pIVar21) {
                if (*(char *)((long)pIVar18 + 0xe) == -2) {
                  if ((ulong)*(byte *)((long)pIVar18 + 0xf) == 0xff) {
                    uVar13 = *(byte *)((long)pIVar18 + 0xd) - 0x48;
                    if ((4 < uVar13) || (uVar13 == 2)) goto LAB_00145f80;
                    pIVar6 = T->ir;
                    pIVar17 = pIVar6 + (pIVar20->field_0).op1;
                    if (((pIVar17->field_1).o & 0xfe) == 0x38) {
                      pIVar17 = pIVar6 + (pIVar17->field_0).op1;
                    }
                    if (pIVar6 + (pIVar17->field_0).op1 != pIVar25) goto LAB_00145f80;
                  }
                  else if (pIVar20 != pIVar25 + *(byte *)((long)pIVar18 + 0xf)) goto LAB_00145f80;
                  TVar12 = snap_pref(J,(GCtrace *)&T->ir->field_0,map,uVar19,seen,
                                     (uint)*(ushort *)((long)pIVar18 + 10));
                  if (TVar12 == 0) {
                    snap_pref(J,(GCtrace *)&T->ir->field_0,map,uVar19,seen,
                              (uint)T->ir[*(ushort *)((long)pIVar18 + 10)].field_0.op1);
                  }
                }
                goto LAB_00145f80;
              }
            }
          }
        }
        else if ((0x7fff < (uVar13 & 0xffff)) && (((pIVar25->field_0).prev & 0xff80) == 0x80)) {
          TVar12 = snap_pref(J,(GCtrace *)&pIVar20->field_0,map,uVar19,seen,
                             (uint)(pIVar25->field_0).op1);
          J->slot[uVar13 >> 0x18] = TVar12;
        }
        uVar24 = uVar24 + 1;
      } while (uVar24 != uVar15);
      bVar7 = true;
      if (bVar8) {
        uVar24 = 0;
        do {
          uVar22 = (ulong)(map[uVar24] & 0xffff);
          pIVar25 = T->ir;
          if (*(char *)((long)pIVar25 + uVar22 * 8 + 6) == -3) {
            uVar13 = map[uVar24] >> 0x18;
            if (J->slot[uVar13] == uVar13) {
              pIVar20 = pIVar25 + uVar22;
              uVar9 = (pIVar20->field_0).op1;
              bVar3 = lj_ir_mode[(pIVar20->field_1).o];
              uVar19 = (uint)bVar2;
              if ((bVar3 & 3) == 0) {
                TVar12 = snap_pref(J,(GCtrace *)&pIVar25->field_0,map,uVar19,seen,(uint)uVar9);
                uVar9 = (ushort)TVar12;
              }
              uVar10 = (pIVar20->field_0).op2;
              if ((bVar3 & 0xc) == 0) {
                TVar12 = snap_pref(J,(GCtrace *)&T->ir->field_0,map,uVar19,seen,(uint)uVar10);
                uVar10 = (ushort)TVar12;
              }
              if ((pIVar20->field_1).o != 'R') {
                (J->fold).ins.field_0.ot = (pIVar20->field_0).ot;
                (J->fold).ins.field_0.op1 = uVar9;
                (J->fold).ins.field_0.op2 = uVar10;
                TVar12 = lj_opt_fold(J);
                J->slot[uVar13] = TVar12;
                pIVar25 = pIVar20 + 1;
                if (pIVar25 < pIVar21) {
                  do {
                    if ((pIVar25->field_1).r == 0xfe) {
                      if ((ulong)(pIVar25->field_1).s == 0xff) {
                        uVar13 = (pIVar25->field_1).o - 0x48;
                        if ((uVar13 < 5) && (uVar13 != 2)) {
                          pIVar17 = T->ir;
                          pIVar18 = pIVar17 + (pIVar25->field_0).op1;
                          if (((pIVar18->field_1).o & 0xfe) == 0x38) {
                            pIVar18 = pIVar17 + (pIVar18->field_0).op1;
                          }
                          if (pIVar17 + (pIVar18->field_0).op1 == pIVar20) goto LAB_00146293;
                        }
                        goto LAB_00146259;
                      }
                      if (pIVar25 != pIVar20 + (pIVar25->field_1).s) goto LAB_00146259;
LAB_00146293:
                      pIVar18 = T->ir;
                      uVar22 = (ulong)(pIVar25->field_0).op1;
                      uVar9 = *(ushort *)((long)pIVar18 + uVar22 * 8 + 2);
                      cVar4 = *(char *)((long)pIVar18 + uVar22 * 8 + 5);
                      IVar11 = (IRRef1)TVar12;
                      if (cVar4 == '>') {
LAB_00146354:
                        (J->fold).ins.field_0.ot = *(IROpT *)((long)pIVar18 + uVar22 * 8 + 4);
                        (J->fold).ins.field_0.op1 = IVar11;
                        (J->fold).ins.field_0.op2 = uVar9;
                        TVar14 = lj_opt_fold(J);
                        uVar10 = (ushort)TVar14;
                      }
                      else {
                        pIVar17 = pIVar18 + uVar9;
                        if (cVar4 == '9') {
                          TVar14 = snap_replay_const(J,pIVar18 + (pIVar17->field_0).op1);
                          TVar14 = lj_ir_kslot(J,TVar14,(uint)(pIVar17->field_0).op2);
                          uVar9 = (ushort)TVar14;
                        }
                        else {
                          TVar14 = snap_replay_const(J,pIVar17);
                          uVar9 = (ushort)TVar14;
                        }
                        bVar3 = *(byte *)((long)pIVar18 + uVar22 * 8 + 5);
                        if (bVar3 - 0x38 < 2) {
                          uVar5 = *(undefined4 *)
                                   ((long)T->ir + (ulong)pIVar18[uVar22].field_0.op1 * 8 + 2);
                          (J->fold).ins.field_0.op1 = IVar11;
                          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = uVar5;
                          TVar14 = lj_opt_fold(J);
                          IVar11 = (IRRef1)TVar14;
                          goto LAB_00146354;
                        }
                        if (bVar3 != 0x3b) goto LAB_00146354;
                        uVar10 = J->chain[0x3b];
                        if (((uint)uVar10 <= (TVar12 & 0xffff)) ||
                           (*(ushort *)((long)(J->cur).ir + (ulong)uVar10 * 8 + 2) != uVar9))
                        goto LAB_00146354;
                      }
                      TVar14 = snap_pref(J,(GCtrace *)&T->ir->field_0,map,uVar19,seen,
                                         (uint)(pIVar25->field_0).op2);
                      if (TVar14 == 0) {
                        TVar14 = snap_pref(J,(GCtrace *)&T->ir->field_0,map,uVar19,seen,
                                           (uint)T->ir[(pIVar25->field_0).op2].field_0.op1);
                        (J->fold).ins.field_0.op1 = (IRRef1)TVar14;
                        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x590e01d3;
                        TVar14 = lj_opt_fold(J);
                      }
                      (J->fold).ins.field_0.ot = (pIVar25->field_0).ot;
                      (J->fold).ins.field_0.op1 = uVar10;
                      (J->fold).ins.field_0.op2 = (IRRef1)TVar14;
                      lj_opt_fold(J);
                    }
                    else {
LAB_00146259:
                      if (((pIVar25->field_1).o == 'X') && ((pIVar20->field_1).o == 'Q')) {
                        (J->fold).ins.field_0.ot = 0x5800;
                        (J->fold).ins.field_1.op12 = 0;
                        lj_opt_fold(J);
                      }
                    }
                    pIVar25 = pIVar25 + 1;
                  } while (pIVar25 < pIVar21);
                }
                goto LAB_0014619f;
              }
              (J->fold).ins.field_0.ot = (pIVar20->field_0).ot & 0xff9f;
              (J->fold).ins.field_0.op1 = uVar9;
              (J->fold).ins.field_0.op2 = uVar10;
              TVar12 = lj_opt_fold(J);
            }
            else {
              TVar12 = J->slot[J->slot[uVar13]];
            }
            J->slot[uVar13] = TVar12;
          }
LAB_0014619f:
          uVar24 = uVar24 + 1;
        } while (uVar24 < uVar15);
        bVar7 = false;
      }
    }
    else {
      bVar7 = true;
    }
  }
  J->base = J->slot + J->baseslot;
  J->maxslot = (uint)pSVar1->nslots - J->baseslot;
  lj_snap_add(J);
  if (!bVar7) {
    (J->fold).ins.field_0.ot = 0xf80;
    (J->fold).ins.field_1.op12 = 0;
    lj_ir_emit(J);
    return;
  }
  return;
}

Assistant:

void lj_snap_replay(jit_State *J, GCtrace *T)
{
  SnapShot *snap = &T->snap[J->exitno];
  SnapEntry *map = &T->snapmap[snap->mapofs];
  MSize n, nent = snap->nent;
  BloomFilter seen = 0;
  int pass23 = 0;
  J->framedepth = 0;
  /* Emit IR for slots inherited from parent snapshot. */
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    BCReg s = snap_slot(sn);
    IRRef ref = snap_ref(sn);
    IRIns *ir = &T->ir[ref];
    TRef tr;
    /* The bloom filter avoids O(nent^2) overhead for de-duping slots. */
    if (bloomtest(seen, ref) && (tr = snap_dedup(J, map, n, ref)) != 0)
      goto setslot;
    bloomset(seen, ref);
    if (irref_isk(ref)) {
      /* See special treatment of LJ_FR2 slot 1 in snapshot_slots() above. */
      if (LJ_FR2 && (sn == SNAP(1, SNAP_FRAME | SNAP_NORESTORE, REF_NIL)))
	tr = 0;
      else
	tr = snap_replay_const(J, ir);
    } else if (!regsp_used(ir->prev)) {
      pass23 = 1;
      lj_assertJ(s != 0, "unused slot 0 in snapshot");
      tr = s;
    } else {
      IRType t = irt_type(ir->t);
      uint32_t mode = IRSLOAD_INHERIT|IRSLOAD_PARENT;
      if (LJ_SOFTFP32 && (sn & SNAP_SOFTFPNUM)) t = IRT_NUM;
      if (ir->o == IR_SLOAD) mode |= (ir->op2 & IRSLOAD_READONLY);
      tr = emitir_raw(IRT(IR_SLOAD, t), s, mode);
    }
  setslot:
    J->slot[s] = tr | (sn&(SNAP_CONT|SNAP_FRAME));  /* Same as TREF_* flags. */
    J->framedepth += ((sn & (SNAP_CONT|SNAP_FRAME)) && (s != LJ_FR2));
    if ((sn & SNAP_FRAME))
      J->baseslot = s+1;
  }
  if (pass23) {
    IRIns *irlast = &T->ir[snap->ref];
    pass23 = 0;
    /* Emit dependent PVALs. */
    for (n = 0; n < nent; n++) {
      SnapEntry sn = map[n];
      IRRef refp = snap_ref(sn);
      IRIns *ir = &T->ir[refp];
      if (regsp_reg(ir->r) == RID_SUNK) {
	uint8_t m;
	if (J->slot[snap_slot(sn)] != snap_slot(sn)) continue;
	pass23 = 1;
	lj_assertJ(ir->o == IR_TNEW || ir->o == IR_TDUP ||
		   ir->o == IR_CNEW || ir->o == IR_CNEWI,
		   "sunk parent IR %04d has bad op %d", refp - REF_BIAS, ir->o);
	m = lj_ir_mode[ir->o];
	if (irm_op1(m) == IRMref) snap_pref(J, T, map, nent, seen, ir->op1);
	if (irm_op2(m) == IRMref) snap_pref(J, T, map, nent, seen, ir->op2);
	if (LJ_HASFFI && ir->o == IR_CNEWI) {
	  if (LJ_32 && refp+1 < T->nins && (ir+1)->o == IR_HIOP)
	    snap_pref(J, T, map, nent, seen, (ir+1)->op2);
	} else {
	  IRIns *irs;
	  for (irs = ir+1; irs < irlast; irs++)
	    if (irs->r == RID_SINK && snap_sunk_store(T, ir, irs)) {
	      if (snap_pref(J, T, map, nent, seen, irs->op2) == 0)
		snap_pref(J, T, map, nent, seen, T->ir[irs->op2].op1);
	      else if ((LJ_SOFTFP32 || (LJ_32 && LJ_HASFFI)) &&
		       irs+1 < irlast && (irs+1)->o == IR_HIOP)
		snap_pref(J, T, map, nent, seen, (irs+1)->op2);
	    }
	}
      } else if (!irref_isk(refp) && !regsp_used(ir->prev)) {
	lj_assertJ(ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT,
		   "sunk parent IR %04d has bad op %d", refp - REF_BIAS, ir->o);
	J->slot[snap_slot(sn)] = snap_pref(J, T, map, nent, seen, ir->op1);
      }
    }
    /* Replay sunk instructions. */
    for (n = 0; pass23 && n < nent; n++) {
      SnapEntry sn = map[n];
      IRRef refp = snap_ref(sn);
      IRIns *ir = &T->ir[refp];
      if (regsp_reg(ir->r) == RID_SUNK) {
	TRef op1, op2;
	uint8_t m;
	if (J->slot[snap_slot(sn)] != snap_slot(sn)) {  /* De-dup allocs. */
	  J->slot[snap_slot(sn)] = J->slot[J->slot[snap_slot(sn)]];
	  continue;
	}
	op1 = ir->op1;
	m = lj_ir_mode[ir->o];
	if (irm_op1(m) == IRMref) op1 = snap_pref(J, T, map, nent, seen, op1);
	op2 = ir->op2;
	if (irm_op2(m) == IRMref) op2 = snap_pref(J, T, map, nent, seen, op2);
	if (LJ_HASFFI && ir->o == IR_CNEWI) {
	  if (LJ_32 && refp+1 < T->nins && (ir+1)->o == IR_HIOP) {
	    lj_needsplit(J);  /* Emit joining HIOP. */
	    op2 = emitir_raw(IRT(IR_HIOP, IRT_I64), op2,
			     snap_pref(J, T, map, nent, seen, (ir+1)->op2));
	  }
	  J->slot[snap_slot(sn)] = emitir(ir->ot & ~(IRT_MARK|IRT_ISPHI), op1, op2);
	} else {
	  IRIns *irs;
	  TRef tr = emitir(ir->ot, op1, op2);
	  J->slot[snap_slot(sn)] = tr;
	  for (irs = ir+1; irs < irlast; irs++)
	    if (irs->r == RID_SINK && snap_sunk_store(T, ir, irs)) {
	      IRIns *irr = &T->ir[irs->op1];
	      TRef val, key = irr->op2, tmp = tr;
	      if (irr->o != IR_FREF) {
		IRIns *irk = &T->ir[key];
		if (irr->o == IR_HREFK)
		  key = lj_ir_kslot(J, snap_replay_const(J, &T->ir[irk->op1]),
				    irk->op2);
		else
		  key = snap_replay_const(J, irk);
		if (irr->o == IR_HREFK || irr->o == IR_AREF) {
		  IRIns *irf = &T->ir[irr->op1];
		  tmp = emitir(irf->ot, tmp, irf->op2);
		} else if (irr->o == IR_NEWREF) {
		  IRRef allocref = tref_ref(tr);
		  IRRef keyref = tref_ref(key);
		  IRRef newref_ref = J->chain[IR_NEWREF];
		  IRIns *newref = &J->cur.ir[newref_ref];
		  lj_assertJ(irref_isk(keyref),
			     "sunk store for parent IR %04d with bad key %04d",
			     refp - REF_BIAS, keyref - REF_BIAS);
		  if (newref_ref > allocref && newref->op2 == keyref) {
		    lj_assertJ(newref->op1 == allocref,
			       "sunk store for parent IR %04d with bad tab %04d",
			       refp - REF_BIAS, allocref - REF_BIAS);
		    tmp = newref_ref;
		    goto skip_newref;
		  }
		}
	      }
	      tmp = emitir(irr->ot, tmp, key);
	    skip_newref:
	      val = snap_pref(J, T, map, nent, seen, irs->op2);
	      if (val == 0) {
		IRIns *irc = &T->ir[irs->op2];
		lj_assertJ(irc->o == IR_CONV && irc->op2 == IRCONV_NUM_INT,
			   "sunk store for parent IR %04d with bad op %d",
			   refp - REF_BIAS, irc->o);
		val = snap_pref(J, T, map, nent, seen, irc->op1);
		val = emitir(IRTN(IR_CONV), val, IRCONV_NUM_INT);
	      } else if ((LJ_SOFTFP32 || (LJ_32 && LJ_HASFFI)) &&
			 irs+1 < irlast && (irs+1)->o == IR_HIOP) {
		IRType t = IRT_I64;
		if (LJ_SOFTFP32 && irt_type((irs+1)->t) == IRT_SOFTFP)
		  t = IRT_NUM;
		lj_needsplit(J);
		if (irref_isk(irs->op2) && irref_isk((irs+1)->op2)) {
		  uint64_t k = (uint32_t)T->ir[irs->op2].i +
			       ((uint64_t)T->ir[(irs+1)->op2].i << 32);
		  val = lj_ir_k64(J, t == IRT_I64 ? IR_KINT64 : IR_KNUM, k);
		} else {
		  val = emitir_raw(IRT(IR_HIOP, t), val,
			  snap_pref(J, T, map, nent, seen, (irs+1)->op2));
		}
		tmp = emitir(IRT(irs->o, t), tmp, val);
		continue;
	      }
	      tmp = emitir(irs->ot, tmp, val);
	    } else if (LJ_HASFFI && irs->o == IR_XBAR && ir->o == IR_CNEW) {
	      emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
	    }
	}
      }
    }
  }
  J->base = J->slot + J->baseslot;
  J->maxslot = snap->nslots - J->baseslot;
  lj_snap_add(J);
  if (pass23)  /* Need explicit GC step _after_ initial snapshot. */
    emitir_raw(IRTG(IR_GCSTEP, IRT_NIL), 0, 0);
}